

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::clear(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
        *this)

{
  bool bVar1;
  qsbr *this_00;
  type word;
  atomic<unsigned_long> *paVar2;
  reference pvVar3;
  basic_node_ptr<unodb::detail::olc_node_header> local_b8;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *local_b0;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  int local_9c;
  memory_order __b_4;
  reference local_90;
  __int_type local_88;
  memory_order local_80;
  int local_7c;
  memory_order __b_3;
  reference local_70;
  __int_type local_68;
  memory_order local_60;
  int local_5c;
  memory_order __b_2;
  reference local_50;
  __int_type local_48;
  memory_order local_40;
  int local_3c;
  memory_order __b_1;
  reference local_30;
  __int_type local_28;
  memory_order local_20;
  int local_1c;
  memory_order __b;
  atomic<unsigned_long> *local_10;
  
  local_b0 = this;
  this_00 = qsbr::instance();
  word = qsbr::get_state(this_00);
  bVar1 = qsbr_state::single_thread_mode(word);
  if (!bVar1) {
    __assert_fail("qsbr_state::single_thread_mode(qsbr::instance().get_state())",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x671,
                  "void unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::clear() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  delete_root_subtree(this);
  detail::basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr(&local_b8,(nullptr_t)0x0);
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
            (&this->root,local_b8);
  paVar2 = &this->current_memory_use;
  ___b = 0;
  local_1c = 0;
  local_10 = paVar2;
  local_20 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_28 = ___b;
  if (local_1c == 3) {
    (paVar2->super___atomic_base<unsigned_long>)._M_i = ___b;
  }
  else if (local_1c == 5) {
    LOCK();
    (paVar2->super___atomic_base<unsigned_long>)._M_i = ___b;
    UNLOCK();
  }
  else {
    (paVar2->super___atomic_base<unsigned_long>)._M_i = ___b;
  }
  pvVar3 = std::array<std::atomic<unsigned_long>,_5UL>::operator[](&this->node_counts,1);
  ___b_1 = 0;
  local_3c = 0;
  local_30 = pvVar3;
  local_40 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_48 = ___b_1;
  if (local_3c == 3) {
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_1;
  }
  else if (local_3c == 5) {
    LOCK();
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_1;
    UNLOCK();
  }
  else {
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_1;
  }
  pvVar3 = std::array<std::atomic<unsigned_long>,_5UL>::operator[](&this->node_counts,2);
  ___b_2 = 0;
  local_5c = 0;
  local_50 = pvVar3;
  local_60 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_68 = ___b_2;
  if (local_5c == 3) {
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_2;
  }
  else if (local_5c == 5) {
    LOCK();
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_2;
    UNLOCK();
  }
  else {
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_2;
  }
  pvVar3 = std::array<std::atomic<unsigned_long>,_5UL>::operator[](&this->node_counts,3);
  ___b_3 = 0;
  local_7c = 0;
  local_70 = pvVar3;
  local_80 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_88 = ___b_3;
  if (local_7c == 3) {
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_3;
  }
  else if (local_7c == 5) {
    LOCK();
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_3;
    UNLOCK();
  }
  else {
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_3;
  }
  pvVar3 = std::array<std::atomic<unsigned_long>,_5UL>::operator[](&this->node_counts,4);
  ___b_4 = 0;
  local_9c = 0;
  local_90 = pvVar3;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_9c == 3) {
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_4;
  }
  else if (local_9c == 5) {
    LOCK();
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_4;
    UNLOCK();
  }
  else {
    (pvVar3->super___atomic_base<unsigned_long>)._M_i = ___b_4;
  }
  return;
}

Assistant:

void olc_db<Key, Value>::clear() noexcept {
  UNODB_DETAIL_ASSERT(
      qsbr_state::single_thread_mode(qsbr::instance().get_state()));

  delete_root_subtree();

  root = detail::olc_node_ptr{nullptr};

#ifdef UNODB_DETAIL_WITH_STATS
  current_memory_use.store(0, std::memory_order_relaxed);

  node_counts[as_i<node_type::I4>].store(0, std::memory_order_relaxed);
  node_counts[as_i<node_type::I16>].store(0, std::memory_order_relaxed);
  node_counts[as_i<node_type::I48>].store(0, std::memory_order_relaxed);
  node_counts[as_i<node_type::I256>].store(0, std::memory_order_relaxed);
#endif  // UNODB_DETAIL_WITH_STATS
}